

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::idchar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  byte bVar1;
  bool bVar2;
  anon_unknown_10 *paVar3;
  
  if (this != (anon_unknown_10 *)0x0) {
    bVar1 = *(byte *)in._M_len;
    bVar2 = false;
    paVar3 = (anon_unknown_10 *)0x1;
    if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
      if (((bVar1 - 0x21 < 0x40) &&
          ((0xe8000000fa00767dU >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) != 0)) ||
         ((bVar1 == 0x7e || (bVar1 == 0x7c)))) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        paVar3 = (anon_unknown_10 *)0x0;
      }
    }
    if (!bVar2) {
      if (this < paVar3) {
        paVar3 = this;
      }
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_len = (size_t)paVar3;
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = (char *)in._M_len;
      bVar2 = true;
      goto LAB_009f2809;
    }
  }
  bVar2 = false;
LAB_009f2809:
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged = bVar2
  ;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> idchar(std::string_view in) {
  LexCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  uint8_t c = ctx.peek();
  if (('0' <= c && c <= '9') || ('A' <= c && c <= 'Z') ||
      ('a' <= c && c <= 'z')) {
    ctx.take(1);
  } else {
    switch (c) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
      case '-':
      case '.':
      case '/':
      case ':':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case '\\':
      case '^':
      case '_':
      case '`':
      case '|':
      case '~':
        ctx.take(1);
    }
  }
  return ctx.lexed();
}